

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

void __thiscall FOptionMenuItemOption::SetSelection(FOptionMenuItemOption *this,int Selection)

{
  uint uVar1;
  FOptionValues *pFVar2;
  Pair *pPVar3;
  Node *pNVar4;
  UCVarValue UVar5;
  Node *pNVar6;
  undefined4 uStack_1c;
  
  uVar1 = *(uint *)&(this->super_FOptionMenuItemOptionBase).super_FOptionMenuItem.field_0x24;
  pNVar4 = OptionValues.Nodes + (OptionValues.Size - 1 & uVar1);
  while( true ) {
    pNVar6 = pNVar4;
    if (pNVar6 == (Node *)0x0) {
      return;
    }
    if (pNVar6->Next == (Node *)0x1) break;
    pNVar4 = pNVar6->Next;
    if ((pNVar6->Pair).Key.Index == uVar1) {
      pFVar2 = (pNVar6->Pair).Value;
      if (((pFVar2 != (FOptionValues *)0x0) && (this->mCVar != (FBaseCVar *)0x0)) &&
         ((pFVar2->mValues).Count != 0)) {
        pPVar3 = (pFVar2->mValues).Array;
        if (*(int *)((pPVar3->TextValue).Chars + -0xc) == 0) {
          UVar5._4_4_ = uStack_1c;
          UVar5.Float = (float)pPVar3[Selection].Value;
          FBaseCVar::SetGenericRep(this->mCVar,UVar5,CVAR_Float);
          return;
        }
        UVar5.String = FString::LockBuffer(&pPVar3[Selection].TextValue);
        FBaseCVar::SetGenericRep(this->mCVar,UVar5,CVAR_String);
        FString::UnlockBuffer(&(((pNVar6->Pair).Value)->mValues).Array[Selection].TextValue);
        return;
      }
      return;
    }
  }
  return;
}

Assistant:

void SetSelection(int Selection)
	{
		UCVarValue value;
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL && mCVar != NULL && (*opt)->mValues.Size() > 0)
		{
			if ((*opt)->mValues[0].TextValue.IsEmpty())
			{
				value.Float = (float)(*opt)->mValues[Selection].Value;
				mCVar->SetGenericRep (value, CVAR_Float);
			}
			else
			{
				value.String = (*opt)->mValues[Selection].TextValue.LockBuffer();
				mCVar->SetGenericRep (value, CVAR_String);
				(*opt)->mValues[Selection].TextValue.UnlockBuffer();
			}
		}
	}